

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O2

int __thiscall cppcms::http::impl::file_buffer::overflow(file_buffer *this,int c)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  pointer pcVar4;
  pointer pcVar5;
  ulong uVar6;
  int iVar7;
  ulong __new_size;
  ulong uVar8;
  
  if (this->in_memory_ == true) {
    uVar8 = *(long *)&this->field_0x28 - *(long *)&this->field_0x20;
    uVar1 = this->limit_;
    if (uVar8 < uVar1) {
      lVar2 = *(long *)&this->field_0x10;
      lVar3 = *(long *)&this->field_0x8;
      uVar6 = ((long)(this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start) * 2;
      __new_size = 0x40;
      if (uVar6 != 0) {
        __new_size = uVar6;
      }
      if (uVar1 <= __new_size) {
        __new_size = uVar1;
      }
      std::vector<char,_std::allocator<char>_>::resize(&this->data_,__new_size);
      pcVar4 = (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5 = (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      *(pointer *)&this->field_0x20 = pcVar4;
      *(pointer *)&this->field_0x30 = pcVar5;
      *(pointer *)&this->field_0x28 = pcVar4 + (int)uVar8;
      *(pointer *)&this->field_0x8 = pcVar4;
      *(pointer *)&this->field_0x10 = pcVar4 + (lVar2 - lVar3);
      *(pointer *)&this->field_0x18 = pcVar4 + (int)uVar8;
    }
    else {
      iVar7 = to_file(this);
      if (iVar7 < 0) {
        return -1;
      }
    }
  }
  else {
    iVar7 = write_buffer(this);
    if (iVar7 != 0) {
      return -1;
    }
    *(undefined8 *)&this->field_0x28 = *(undefined8 *)&this->field_0x20;
  }
  if (c != -1) {
    **(undefined1 **)&this->field_0x28 = (char)c;
    *(long *)&this->field_0x28 = *(long *)&this->field_0x28 + 1;
  }
  return 0;
}

Assistant:

int overflow(int c)
	{
		size_t size = pptr() - pbase();
		if(in_memory_) {
			if(size >= limit_) {
				if(to_file() < 0)
					return -1;
			}
			else {
				size_t read_offset =gptr() - eback();
				size_t new_size = data_.size() * 2;
				if(new_size == 0)
					new_size = 64;
				if(new_size > limit_)
					new_size = limit_;
				data_.resize(new_size);

				setp(&data_[0],&data_[0] + data_.size());
				pbump(size);

				setg(pbase(),pbase() + read_offset,pptr());
			}
		}
		else {
			if(write_buffer()!= 0)
				return -1;
			setp(pbase(),epptr());
		}
		if(c!=EOF) {
			*pptr() = c;
			pbump(1);
		}
		return 0;
	}